

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

size_t CLI::detail::close_string_quote(string *str,size_t start,char closure_char)

{
  ulong uVar1;
  char *pcVar2;
  char in_DL;
  long in_RSI;
  ulong in_RDI;
  size_t loc;
  ulong local_20;
  
  local_20 = in_RSI + 1;
  while ((uVar1 = ::std::__cxx11::string::size(), local_20 < uVar1 &&
         (pcVar2 = (char *)::std::__cxx11::string::operator[](in_RDI), *pcVar2 != in_DL))) {
    pcVar2 = (char *)::std::__cxx11::string::operator[](in_RDI);
    if (*pcVar2 == '\\') {
      local_20 = local_20 + 1;
    }
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

CLI11_INLINE std::size_t close_string_quote(const std::string &str, std::size_t start, char closure_char) {
    std::size_t loc{0};
    for(loc = start + 1; loc < str.size(); ++loc) {
        if(str[loc] == closure_char) {
            break;
        }
        if(str[loc] == '\\') {
            // skip the next character for escaped sequences
            ++loc;
        }
    }
    return loc;
}